

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_state_pasv_resp(Curl_easy *data,int ftpcode)

{
  char *pcVar1;
  undefined1 *puVar2;
  char cVar3;
  connectdata *conn;
  ConnectBits CVar4;
  curl_trc_feat *pcVar5;
  proxy_info *ppVar6;
  int iVar7;
  CURLcode CVar8;
  char *pcVar9;
  ulong uVar10;
  ip_quadruple *piVar11;
  uint uVar12;
  bool bVar13;
  Curl_dns_entry *dns;
  curl_off_t num;
  curl_off_t num_1;
  char *p;
  Curl_dns_entry *local_158;
  char *local_150;
  Curl_easy *local_148;
  undefined4 local_140 [2];
  undefined8 local_138;
  uint local_130;
  uint local_12c;
  int local_128;
  short local_124;
  
  conn = data->conn;
  local_158 = (Curl_dns_entry *)0x0;
  pcVar9 = Curl_dyn_ptr(&(conn->proto).ftpc.pp.recvbuf);
  pcVar9 = pcVar9 + 4;
  (*Curl_cfree)((conn->proto).ftpc.newhost);
  (conn->proto).ftpc.newhost = (char *)0x0;
  iVar7 = (conn->proto).ftpc.count1;
  if (ftpcode == 0xe5 && iVar7 == 0) {
    pcVar9 = strchr(pcVar9,0x28);
    if ((((pcVar9 == (char *)0x0) || (cVar3 = pcVar9[1], pcVar9[2] != cVar3)) ||
        (pcVar9[3] != cVar3)) || (9 < (byte)(pcVar9[4] - 0x30U))) {
      pcVar9 = "Weirdly formatted EPSV reply";
    }
    else {
      local_138 = pcVar9 + 4;
      iVar7 = Curl_str_number((char **)&local_138,(curl_off_t *)&local_150,0xffff);
      if ((iVar7 == 0) && (*local_138 == cVar3)) {
        (conn->proto).ftpc.newport = (unsigned_short)local_150;
        if (((ulong)conn->bits & 10) == 0) {
          piVar11 = &conn->primary;
        }
        else {
          piVar11 = (ip_quadruple *)(conn->host).name;
        }
        pcVar9 = (*Curl_cstrdup)(piVar11->remote_ip);
        (conn->proto).ftpc.newhost = pcVar9;
        if (pcVar9 != (char *)0x0) {
LAB_0012cb29:
          CVar4 = conn->bits;
          if (((ulong)CVar4 & 0x10) == 0) {
            if (((CVar4._0_4_ & 0x800040) == 0x800000) && (*pcVar9 == '\0')) {
              (*Curl_cfree)(pcVar9);
              if (((ulong)conn->bits & 10) == 0) {
                piVar11 = &conn->primary;
              }
              else {
                piVar11 = (ip_quadruple *)(conn->host).name;
              }
              pcVar9 = (*Curl_cstrdup)(piVar11->remote_ip);
              (conn->proto).ftpc.newhost = pcVar9;
              if (pcVar9 == (char *)0x0) {
                return CURLE_OUT_OF_MEMORY;
              }
            }
            Curl_resolv_blocking
                      (data,pcVar9,(uint)(conn->proto).ftpc.newport,(uint)conn->ip_version,
                       &local_158);
            uVar12 = (uint)(conn->proto).ftpc.newport;
            if (local_158 == (Curl_dns_entry *)0x0) {
              Curl_failf(data,"cannot resolve new host %s:%hu",(conn->proto).ftpc.newhost,
                         (ulong)uVar12);
              return CURLE_FTP_CANT_GET_HOST;
            }
          }
          else {
            ppVar6 = &conn->socks_proxy;
            if (((ulong)CVar4 & 2) == 0) {
              ppVar6 = &conn->http_proxy;
            }
            pcVar9 = (ppVar6->host).name;
            Curl_resolv_blocking
                      (data,pcVar9,(conn->primary).remote_port,(uint)conn->ip_version,&local_158);
            uVar12 = (conn->primary).remote_port;
            if (local_158 == (Curl_dns_entry *)0x0) {
              Curl_failf(data,"cannot resolve proxy host %s:%hu",pcVar9,(ulong)(uVar12 & 0xffff));
              return CURLE_COULDNT_RESOLVE_PROXY;
            }
          }
          CVar8 = Curl_conn_setup(data,conn,1,local_158,*(uint *)&conn->bits >> 0x11 & 1);
          if (CVar8 != CURLE_OK) {
            Curl_resolv_unlink(data,&local_158);
            if (ftpcode != 0xe5) {
              return CVar8;
            }
            if ((conn->proto).ftpc.count1 == 0) {
              CVar8 = ftp_epsv_disable(data,conn);
              return CVar8;
            }
            return CVar8;
          }
          if (((data->set).field_0x89f & 0x40) != 0) {
            pcVar9 = (conn->proto).ftpc.newhost;
            Curl_printable_address(local_158->addr,(char *)&local_138,0x100);
            if ((((data->set).field_0x89f & 0x40) != 0) &&
               ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 ||
                (0 < pcVar5->log_level)))) {
              Curl_infof(data,"Connecting to %s (%s) port %d",pcVar9,&local_138,
                         (ulong)(uVar12 & 0xffff));
            }
          }
          Curl_resolv_unlink(data,&local_158);
          (*Curl_cfree)(conn->secondaryhostname);
          conn->secondary_port = (conn->proto).ftpc.newport;
          pcVar9 = (*Curl_cstrdup)((conn->proto).ftpc.newhost);
          conn->secondaryhostname = pcVar9;
          if (pcVar9 != (char *)0x0) {
            puVar2 = &(conn->bits).field_0x1;
            *puVar2 = *puVar2 | 0x10;
            _ftp_state(data,'\0');
            return CURLE_OK;
          }
        }
        return CURLE_OUT_OF_MEMORY;
      }
      pcVar9 = "Illegal port number in EPSV reply";
    }
    Curl_failf(data,pcVar9);
  }
  else {
    if (ftpcode == 0xe3 && iVar7 == 1) {
      local_148 = data;
      if (*pcVar9 == '\0') {
LAB_0012ca4a:
        Curl_failf(local_148,"Couldn\'t interpret the 227-response");
        return CURLE_FTP_WEIRD_227_FORMAT;
      }
LAB_0012c95a:
      uVar10 = 0;
      bVar13 = false;
      local_150 = pcVar9;
      do {
        if (uVar10 != 0) {
          if (*local_150 != ',') goto LAB_0012c9ad;
          local_150 = local_150 + 1;
        }
        iVar7 = Curl_str_number(&local_150,(curl_off_t *)local_140,0xff);
        if (iVar7 != 0) goto LAB_0012c9ad;
        *(undefined4 *)((long)&local_138 + uVar10 * 4) = local_140[0];
        bVar13 = 4 < uVar10;
        uVar10 = uVar10 + 1;
        if (uVar10 == 6) goto LAB_0012ca0d;
      } while( true );
    }
    if (iVar7 == 0) {
      CVar8 = ftp_epsv_disable(data,conn);
      return CVar8;
    }
    Curl_failf(data,"Bad PASV/EPSV response: %03d",(ulong)(uint)ftpcode);
  }
  return CURLE_FTP_WEIRD_PASV_REPLY;
LAB_0012c9ad:
  if (bVar13) {
LAB_0012ca0d:
    data = local_148;
    if (*pcVar9 != '\0') {
      uVar12 = (uint)*(undefined8 *)&(local_148->set).field_0x89c;
      if ((uVar12 >> 0x13 & 1) == 0) {
        pcVar9 = curl_maprintf("%u.%u.%u.%u",(ulong)local_138 & 0xffffffff,(ulong)local_138._4_4_,
                               (ulong)local_130,(ulong)local_12c);
      }
      else {
        if (((uVar12 >> 0x1e & 1) != 0) &&
           ((pcVar5 = (local_148->state).feat, pcVar5 == (curl_trc_feat *)0x0 ||
            (0 < pcVar5->log_level)))) {
          Curl_infof(local_148,"Skip %u.%u.%u.%u for data connection, reuse %s instead",
                     (ulong)local_138 & 0xffffffff,(ulong)local_138._4_4_,(ulong)local_130,
                     (ulong)local_12c,(conn->host).name);
        }
        if (((ulong)conn->bits & 10) == 0) {
          piVar11 = &conn->primary;
        }
        else {
          piVar11 = (ip_quadruple *)(conn->host).name;
        }
        pcVar9 = (*Curl_cstrdup)(piVar11->remote_ip);
      }
      (conn->proto).ftpc.newhost = pcVar9;
      if (pcVar9 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      (conn->proto).ftpc.newport = (short)(local_128 << 8) + local_124;
      goto LAB_0012cb29;
    }
    goto LAB_0012ca4a;
  }
  pcVar1 = pcVar9 + 1;
  pcVar9 = pcVar9 + 1;
  if (*pcVar1 == '\0') goto LAB_0012ca4a;
  goto LAB_0012c95a;
}

Assistant:

static CURLcode ftp_state_pasv_resp(struct Curl_easy *data,
                                    int ftpcode)
{
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  CURLcode result;
  struct Curl_dns_entry *dns = NULL;
  unsigned short connectport; /* the local port connect() should use! */
  struct pingpong *pp = &ftpc->pp;
  char *str =
    Curl_dyn_ptr(&pp->recvbuf) + 4; /* start on the first letter */

  /* if we come here again, make sure the former name is cleared */
  Curl_safefree(ftpc->newhost);

  if((ftpc->count1 == 0) &&
     (ftpcode == 229)) {
    /* positive EPSV response */
    char *ptr = strchr(str, '(');
    if(ptr) {
      char sep;
      ptr++;
      /* |||12345| */
      sep = ptr[0];
      if((ptr[1] == sep) && (ptr[2] == sep) && ISDIGIT(ptr[3])) {
        const char *p = &ptr[3];
        curl_off_t num;
        if(Curl_str_number(&p, &num, 0xffff) || (*p != sep)) {
          failf(data, "Illegal port number in EPSV reply");
          return CURLE_FTP_WEIRD_PASV_REPLY;
        }
        ftpc->newport = (unsigned short)num;
        ftpc->newhost = strdup(control_address(conn));
        if(!ftpc->newhost)
          return CURLE_OUT_OF_MEMORY;
      }
      else
        ptr = NULL;
    }
    if(!ptr) {
      failf(data, "Weirdly formatted EPSV reply");
      return CURLE_FTP_WEIRD_PASV_REPLY;
    }
  }
  else if((ftpc->count1 == 1) &&
          (ftpcode == 227)) {
    /* positive PASV response */
    unsigned int ip[6];

    /*
     * Scan for a sequence of six comma-separated numbers and use them as
     * IP+port indicators.
     *
     * Found reply-strings include:
     * "227 Entering Passive Mode (127,0,0,1,4,51)"
     * "227 Data transfer will passively listen to 127,0,0,1,4,51"
     * "227 Entering passive mode. 127,0,0,1,4,51"
     */
    while(*str) {
      if(match_pasv_6nums(str, ip))
        break;
      str++;
    }

    if(!*str) {
      failf(data, "Couldn't interpret the 227-response");
      return CURLE_FTP_WEIRD_227_FORMAT;
    }

    /* we got OK from server */
    if(data->set.ftp_skip_ip) {
      /* told to ignore the remotely given IP but instead use the host we used
         for the control connection */
      infof(data, "Skip %u.%u.%u.%u for data connection, reuse %s instead",
            ip[0], ip[1], ip[2], ip[3],
            conn->host.name);
      ftpc->newhost = strdup(control_address(conn));
    }
    else
      ftpc->newhost = aprintf("%u.%u.%u.%u", ip[0], ip[1], ip[2], ip[3]);

    if(!ftpc->newhost)
      return CURLE_OUT_OF_MEMORY;

    ftpc->newport = (unsigned short)(((ip[4] << 8) + ip[5]) & 0xffff);
  }
  else if(ftpc->count1 == 0) {
    /* EPSV failed, move on to PASV */
    return ftp_epsv_disable(data, conn);
  }
  else {
    failf(data, "Bad PASV/EPSV response: %03d", ftpcode);
    return CURLE_FTP_WEIRD_PASV_REPLY;
  }

#ifndef CURL_DISABLE_PROXY
  if(conn->bits.proxy) {
    /*
     * This connection uses a proxy and we need to connect to the proxy again
     * here. We do not want to rely on a former host lookup that might've
     * expired now, instead we remake the lookup here and now!
     */
    const char * const host_name = conn->bits.socksproxy ?
      conn->socks_proxy.host.name : conn->http_proxy.host.name;
    (void)Curl_resolv_blocking(data, host_name, conn->primary.remote_port,
                               conn->ip_version, &dns);
    /* we connect to the proxy's port */
    connectport = (unsigned short)conn->primary.remote_port;

    if(!dns) {
      failf(data, "cannot resolve proxy host %s:%hu", host_name, connectport);
      return CURLE_COULDNT_RESOLVE_PROXY;
    }
  }
  else
#endif
  {
    /* normal, direct, ftp connection */
    DEBUGASSERT(ftpc->newhost);

    /* postponed address resolution in case of tcp fastopen */
    if(conn->bits.tcp_fastopen && !conn->bits.reuse && !ftpc->newhost[0]) {
      free(ftpc->newhost);
      ftpc->newhost = strdup(control_address(conn));
      if(!ftpc->newhost)
        return CURLE_OUT_OF_MEMORY;
    }

    (void)Curl_resolv_blocking(data, ftpc->newhost, ftpc->newport,
                               conn->ip_version, &dns);
    connectport = ftpc->newport; /* we connect to the remote port */

    if(!dns) {
      failf(data, "cannot resolve new host %s:%hu",
            ftpc->newhost, connectport);
      return CURLE_FTP_CANT_GET_HOST;
    }
  }

  result = Curl_conn_setup(data, conn, SECONDARYSOCKET, dns,
                           conn->bits.ftp_use_data_ssl ?
                           CURL_CF_SSL_ENABLE : CURL_CF_SSL_DISABLE);

  if(result) {
    Curl_resolv_unlink(data, &dns); /* we are done using this dns entry */
    if(ftpc->count1 == 0 && ftpcode == 229)
      return ftp_epsv_disable(data, conn);

    return result;
  }


  /*
   * When this is used from the multi interface, this might've returned with
   * the 'connected' set to FALSE and thus we are now awaiting a non-blocking
   * connect to connect.
   */

  if(data->set.verbose)
    /* this just dumps information about this second connection */
    ftp_pasv_verbose(data, dns->addr, ftpc->newhost, connectport);

  Curl_resolv_unlink(data, &dns); /* we are done using this address */

  free(conn->secondaryhostname);
  conn->secondary_port = ftpc->newport;
  conn->secondaryhostname = strdup(ftpc->newhost);
  if(!conn->secondaryhostname)
    return CURLE_OUT_OF_MEMORY;

  conn->bits.do_more = TRUE;
  ftp_state(data, FTP_STOP); /* this phase is completed */

  return result;
}